

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copyall.cpp
# Opt level: O0

int copyall_main(int argc,char **argv)

{
  undefined1 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined8 uVar5;
  DB *pDVar6;
  pointer pIVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 uVar8;
  undefined8 *in_RSI;
  int in_EDI;
  Slice value;
  Slice key;
  Status status;
  unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_> it;
  DecompressAllocator decompress_allocator;
  ReadOptions readOptions;
  DB copy_db;
  DB db;
  string copy_path;
  string path;
  pointer in_stack_ffffffffffffebc8;
  FILE *pFVar9;
  DB *in_stack_ffffffffffffebd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffebd8;
  allocator<char> *in_stack_ffffffffffffec00;
  char *in_stack_ffffffffffffec08;
  Slice *this;
  undefined7 in_stack_ffffffffffffec10;
  undefined1 in_stack_ffffffffffffec17;
  Status *in_stack_ffffffffffffec28;
  undefined1 in_stack_ffffffffffffec76;
  undefined1 in_stack_ffffffffffffec77;
  char *in_stack_ffffffffffffec78;
  undefined7 in_stack_ffffffffffffec80;
  undefined1 in_stack_ffffffffffffec87;
  string local_1358 [32];
  string local_1338 [32];
  string local_1318 [39];
  undefined1 local_12f1;
  undefined1 local_12f0 [8];
  Status *local_12e8 [2];
  undefined8 local_12d8 [2];
  Slice local_12c8;
  DecompressAllocator local_12b8;
  ReadOptions local_1270 [95];
  undefined4 local_984;
  allocator<char> local_a9;
  string local_a8 [32];
  string local_88 [55];
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [32];
  undefined8 *local_10;
  int local_4;
  
  local_10 = in_RSI;
  if ((in_EDI < 4) || (iVar3 = strcmp("help",(char *)in_RSI[1]), iVar3 == 0)) {
    printf("Usage: %s copyall <source_minecraft_world_dir> <dest_minecraft_world_dir>\n",*local_10);
    return 1;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec17,in_stack_ffffffffffffec10),in_stack_ffffffffffffec08
             ,in_stack_ffffffffffffec00);
  std::operator+(in_stack_ffffffffffffebd8,(char *)in_stack_ffffffffffffebd0);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffec17,in_stack_ffffffffffffec10),in_stack_ffffffffffffec08
             ,in_stack_ffffffffffffec00);
  std::operator+(in_stack_ffffffffffffebd8,(char *)in_stack_ffffffffffffebd0);
  std::__cxx11::string::~string(local_a8);
  std::allocator<char>::~allocator(&local_a9);
  std::__cxx11::string::c_str();
  mcberepair::DB::DB((DB *)CONCAT17(in_stack_ffffffffffffec87,in_stack_ffffffffffffec80),
                     in_stack_ffffffffffffec78,(bool)in_stack_ffffffffffffec77,
                     (bool)in_stack_ffffffffffffec76);
  uVar1 = mcberepair::DB::operator_cast_to_bool((DB *)0x10d8e6);
  if ((bool)uVar1) {
    std::__cxx11::string::c_str();
    mcberepair::DB::DB((DB *)CONCAT17(uVar1,in_stack_ffffffffffffec80),in_stack_ffffffffffffec78,
                       (bool)in_stack_ffffffffffffec77,(bool)in_stack_ffffffffffffec76);
    bVar2 = mcberepair::DB::operator_cast_to_bool((DB *)0x10da4a);
    pFVar9 = _stderr;
    if (bVar2) {
      leveldb::ReadOptions::ReadOptions(local_1270);
      leveldb::DecompressAllocator::DecompressAllocator
                ((DecompressAllocator *)in_stack_ffffffffffffebd0);
      local_1270[0].verify_checksums = true;
      local_1270[0].fill_cache = false;
      local_1270[0].decompress_allocator = &local_12b8;
      pDVar6 = mcberepair::DB::operator()((DB *)0x10db1b);
      (*pDVar6->_vptr_DB[6])(pDVar6,local_1270);
      std::unique_ptr<leveldb::Iterator,std::default_delete<leveldb::Iterator>>::
      unique_ptr<std::default_delete<leveldb::Iterator>,void>
                ((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_> *)
                 in_stack_ffffffffffffebd0,in_stack_ffffffffffffebc8);
      leveldb::Status::Status((Status *)&local_12c8);
      pIVar7 = std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::
               operator->((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_> *)
                          0x10db7f);
      (*pIVar7->_vptr_Iterator[3])();
      while( true ) {
        pIVar7 = std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::
                 operator->((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>
                             *)0x10db9c);
        uVar4 = (*pIVar7->_vptr_Iterator[2])();
        if ((uVar4 & 1) == 0) break;
        pIVar7 = std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::
                 operator->((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>
                             *)0x10dbc8);
        iVar3 = (*pIVar7->_vptr_Iterator[8])();
        local_12d8[0] = CONCAT44(extraout_var,iVar3);
        pIVar7 = std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::
                 operator->((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>
                             *)0x10dc07);
        iVar3 = (*pIVar7->_vptr_Iterator[9])();
        in_stack_ffffffffffffec28 = (Status *)CONCAT44(extraout_var_00,iVar3);
        local_12e8[0] = in_stack_ffffffffffffec28;
        pDVar6 = mcberepair::DB::operator()((DB *)0x10dc46);
        local_12f1 = 0;
        (*pDVar6->_vptr_DB[2])(local_12f0,pDVar6,&local_12f1,local_12d8,local_12e8);
        this = &local_12c8;
        leveldb::Status::operator=
                  ((Status *)in_stack_ffffffffffffebd0,(Status *)in_stack_ffffffffffffebc8);
        leveldb::Status::~Status((Status *)in_stack_ffffffffffffebd0);
        bVar2 = leveldb::Status::ok((Status *)this);
        pFVar9 = _stderr;
        if (!bVar2) {
          leveldb::Slice::ToString_abi_cxx11_(this);
          uVar5 = std::__cxx11::string::c_str();
          leveldb::Status::ToString_abi_cxx11_(in_stack_ffffffffffffec28);
          uVar8 = std::__cxx11::string::c_str();
          fprintf(pFVar9,"ERROR: copying key \'%s\' failed: %s\n",uVar5,uVar8);
          std::__cxx11::string::~string(local_1338);
          std::__cxx11::string::~string(local_1318);
          local_4 = 1;
          goto LAB_0010deee;
        }
        pIVar7 = std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::
                 operator->((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>
                             *)0x10dddf);
        (*pIVar7->_vptr_Iterator[6])();
      }
      pDVar6 = mcberepair::DB::operator()((DB *)0x10ddff);
      (*pDVar6->_vptr_DB[0xb])(pDVar6,0);
      bVar2 = leveldb::Status::ok((Status *)&local_12c8);
      if (bVar2) {
        local_4 = 0;
      }
      else {
        pFVar9 = _stderr;
        in_stack_ffffffffffffebd0 = (DB *)std::__cxx11::string::c_str();
        uVar5 = std::__cxx11::string::c_str();
        leveldb::Status::ToString_abi_cxx11_(in_stack_ffffffffffffec28);
        uVar8 = std::__cxx11::string::c_str();
        fprintf(pFVar9,"ERROR: copying \'%s\' to \'%s\' failed: %s\n",in_stack_ffffffffffffebd0,
                uVar5,uVar8);
        std::__cxx11::string::~string(local_1358);
        local_4 = 1;
      }
LAB_0010deee:
      local_984 = 1;
      leveldb::Status::~Status((Status *)in_stack_ffffffffffffebd0);
      std::unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_>::~unique_ptr
                ((unique_ptr<leveldb::Iterator,_std::default_delete<leveldb::Iterator>_> *)
                 in_stack_ffffffffffffebd0);
      leveldb::DecompressAllocator::~DecompressAllocator((DecompressAllocator *)0x10df15);
    }
    else {
      uVar5 = std::__cxx11::string::c_str();
      fprintf(pFVar9,"ERROR: Opening \'%s\' failed.\n",uVar5);
      local_4 = 1;
      local_984 = 1;
    }
    mcberepair::DB::~DB(in_stack_ffffffffffffebd0);
  }
  else {
    pFVar9 = _stderr;
    uVar5 = std::__cxx11::string::c_str();
    fprintf(pFVar9,"ERROR: Opening \'%s\' failed.\n",uVar5);
    local_4 = 1;
    local_984 = 1;
  }
  mcberepair::DB::~DB(in_stack_ffffffffffffebd0);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_30);
  return local_4;
}

Assistant:

int copyall_main(int argc, char *argv[]) {
    if(argc < 4 || strcmp("help", argv[1]) == 0) {
        printf(
            "Usage: %s copyall <source_minecraft_world_dir> "
            "<dest_minecraft_world_dir>\n",
            argv[0]);
        return EXIT_FAILURE;
    }

    // construct path for Minecraft BE database
    std::string path = std::string(argv[2]) + "/db";
    std::string copy_path = std::string(argv[3]) + "/db";

    // open the input database
    mcberepair::DB db{path.c_str()};

    if(!db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", path.c_str());
        return EXIT_FAILURE;
    }

    // open the destination database
    mcberepair::DB copy_db{copy_path.c_str(), true, true};

    if(!copy_db) {
        fprintf(stderr, "ERROR: Opening '%s' failed.\n", copy_path.c_str());
        return EXIT_FAILURE;
    }

    // create a reusable memory space for decompression so it allocates less
    leveldb::ReadOptions readOptions;
    leveldb::DecompressAllocator decompress_allocator;
    readOptions.decompress_allocator = &decompress_allocator;
    readOptions.verify_checksums = true;
    readOptions.fill_cache = false;

    // create an iterator for the database
    auto it = std::unique_ptr<leveldb::Iterator>{db().NewIterator(readOptions)};

    leveldb::Status status;

    for(it->SeekToFirst(); it->Valid(); it->Next()) {
        auto key = it->key();
        auto value = it->value();
        status = copy_db().Put({}, key, value);
        if(!status.ok()) {
            // LCOV_EXCL_START
            fprintf(stderr, "ERROR: copying key '%s' failed: %s\n",
                    key.ToString().c_str(), status.ToString().c_str());
            return EXIT_FAILURE;
            // LCOV_EXCL_STOP
        }
    }
    copy_db().CompactRange(nullptr, nullptr);

    if(!status.ok()) {
        // LCOV_EXCL_START
        fprintf(stderr, "ERROR: copying '%s' to '%s' failed: %s\n",
                path.c_str(), copy_path.c_str(), status.ToString().c_str());
        return EXIT_FAILURE;
        // LCOV_EXCL_STOP
    }
    return EXIT_SUCCESS;
}